

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

FDoomEdEntry * __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Insert
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,int key,
          FDoomEdEntry *value)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  Node *local_28;
  Node *n;
  FDoomEdEntry *value_local;
  int key_local;
  TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this_local;
  
  local_28 = FindKey(this,key);
  if (local_28 == (Node *)0x0) {
    local_28 = NewKey(this,key);
    (local_28->Pair).Value.Type = value->Type;
    cVar1 = value->ArgsDefined;
    uVar2 = value->field_0xb;
    iVar3 = value->Args[0];
    (local_28->Pair).Value.Special = value->Special;
    (local_28->Pair).Value.ArgsDefined = cVar1;
    (local_28->Pair).Value.field_0xb = uVar2;
    (local_28->Pair).Value.Args[0] = iVar3;
    *(undefined8 *)((local_28->Pair).Value.Args + 1) = *(undefined8 *)(value->Args + 1);
    *(undefined8 *)((local_28->Pair).Value.Args + 3) = *(undefined8 *)(value->Args + 3);
  }
  else {
    (local_28->Pair).Value.Type = value->Type;
    cVar1 = value->ArgsDefined;
    uVar2 = value->field_0xb;
    iVar3 = value->Args[0];
    (local_28->Pair).Value.Special = value->Special;
    (local_28->Pair).Value.ArgsDefined = cVar1;
    (local_28->Pair).Value.field_0xb = uVar2;
    (local_28->Pair).Value.Args[0] = iVar3;
    *(undefined8 *)((local_28->Pair).Value.Args + 1) = *(undefined8 *)(value->Args + 1);
    *(undefined8 *)((local_28->Pair).Value.Args + 3) = *(undefined8 *)(value->Args + 3);
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}